

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::CanProveConditionalBranch
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Var src1Var,Var src2Var,
          bool *result)

{
  ValueInfo *pVVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  ObjectType OVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 uVar8;
  Func *pFVar9;
  ValueType *pVVar10;
  ValueType *pVVar11;
  bool bVar12;
  ulong local_50;
  int64 right64;
  int64 left64;
  uint local_38;
  uint local_34;
  int32 left;
  int32 right;
  
  switch(instr->m_opcode) {
  case BrNotEq_A:
switchD_00434404_caseD_194:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
         bVar3)) {
        bVar3 = local_38 == local_34;
        goto LAB_004355b0;
      }
      bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)&DAT_00000001,
                         (bool)uVar8);
      if (bVar3) goto LAB_0043531c;
    }
    if (src1Var == (Var)0x0 || src2Var == (Var)0x0) {
      bVar4 = anon_unknown.dwarf_e6eced::BoolAndIntStaticAndTypeMismatch
                        (src1Val,src2Val,src1Var,src2Var);
      goto LAB_0043542e;
    }
    pFVar9 = this->func;
    bVar3 = false;
    goto LAB_00435343;
  case BrNotNeq_A:
switchD_00434404_caseD_195:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      left64 = (int64)this;
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
         bVar3)) {
        bVar3 = local_38 == local_34;
        goto LAB_004355b4;
      }
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)&DAT_00000001,
                         (bool)uVar8);
      bVar3 = true;
      this = (GlobOpt *)left64;
      if (bVar4) goto LAB_004355b4;
    }
    if (src1Var != (Var)0x0 && src2Var != (Var)0x0) {
      pFVar9 = this->func;
      bVar3 = false;
      goto LAB_00435398;
    }
    bVar4 = anon_unknown.dwarf_e6eced::BoolAndIntStaticAndTypeMismatch
                      (src1Val,src2Val,src1Var,src2Var);
    goto LAB_004353e1;
  case BrSrNotEq_A:
switchD_00434404_caseD_196:
    uVar8 = src2Var != (Var)0x0;
    if (src1Var == (Var)0x0 || !(bool)uVar8) {
      pVVar1 = src2Val->valueInfo;
      pVVar10 = &src1Val->valueInfo->super_ValueType;
      left64 = (int64)src2Val;
      bVar3 = ValueType::IsUndefined(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if (bVar3) {
          bVar4 = ValueType::HasBeenUndefined(&pVVar1->super_ValueType);
          bVar3 = true;
          if (!bVar4) goto LAB_004355b4;
        }
      }
      bVar3 = ValueType::IsNull(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if (bVar3) {
          bVar4 = ValueType::HasBeenNull(&pVVar1->super_ValueType);
          bVar3 = true;
          if (!bVar4) goto LAB_004355b4;
        }
      }
      bVar3 = ValueType::IsBoolean(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if (bVar3) {
          bVar4 = ValueType::HasBeenBoolean(&pVVar1->super_ValueType);
          bVar3 = true;
          if (!bVar4) goto LAB_004355b4;
        }
      }
      bVar3 = ValueType::IsNumber(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if (bVar3) {
          bVar4 = ValueType::HasBeenNumber(&pVVar1->super_ValueType);
          bVar3 = true;
          if (!bVar4) goto LAB_004355b4;
        }
      }
      bVar3 = ValueType::IsString(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if (bVar3) {
          bVar4 = ValueType::HasBeenString(&pVVar1->super_ValueType);
          bVar3 = true;
          if (!bVar4) goto LAB_004355b4;
        }
      }
      pVVar11 = &pVVar1->super_ValueType;
      bVar3 = ValueType::IsUndefined(pVVar11);
      if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar10), bVar3)) {
        bVar4 = ValueType::HasBeenUndefined(pVVar10);
        bVar3 = true;
        if (!bVar4) goto LAB_004355b4;
      }
      bVar3 = ValueType::IsNull(pVVar11);
      if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar10), bVar3)) {
        bVar4 = ValueType::HasBeenNull(pVVar10);
        bVar3 = true;
        if (!bVar4) goto LAB_004355b4;
      }
      bVar3 = ValueType::IsBoolean(pVVar11);
      if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar10), bVar3)) {
        bVar4 = ValueType::HasBeenBoolean(pVVar10);
        bVar3 = true;
        if (!bVar4) goto LAB_004355b4;
      }
      bVar3 = ValueType::IsNumber(pVVar11);
      if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar10), bVar3)) {
        bVar4 = ValueType::HasBeenNumber(pVVar10);
        bVar3 = true;
        if (!bVar4) goto LAB_004355b4;
      }
      bVar3 = ValueType::IsString(pVVar11);
      if ((bVar3) && (bVar3 = ValueType::IsDefinite(pVVar10), bVar3)) {
        bVar4 = ValueType::HasBeenString(pVVar10);
        bVar3 = true;
        if (!bVar4) goto LAB_004355b4;
      }
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)left64,(Value *)&DAT_00000001,
                         (bool)uVar8);
      goto LAB_004353e1;
    }
    pFVar9 = this->func;
    bVar3 = true;
LAB_00435343:
    bVar3 = anon_unknown.dwarf_e6eced::Op_JitNeq
                      (result,src1Val,src2Val,src1Var,src2Var,pFVar9,bVar3);
LAB_004353ad:
    if (bVar3 != false) {
      return true;
    }
switchD_00434404_caseD_19c:
    return false;
  case BrSrNotNeq_A:
switchD_00434404_caseD_197:
    uVar8 = src2Var != (Var)0x0;
    if (src1Var == (Var)0x0 || !(bool)uVar8) {
      pVVar1 = src2Val->valueInfo;
      pVVar10 = &src1Val->valueInfo->super_ValueType;
      bVar3 = ValueType::IsUndefined(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if ((bVar3) && (bVar3 = ValueType::HasBeenUndefined(&pVVar1->super_ValueType), !bVar3))
        goto LAB_0043531c;
      }
      bVar3 = ValueType::IsNull(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if ((bVar3) && (bVar3 = ValueType::HasBeenNull(&pVVar1->super_ValueType), !bVar3))
        goto LAB_0043531c;
      }
      bVar3 = ValueType::IsBoolean(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if ((bVar3) && (bVar3 = ValueType::HasBeenBoolean(&pVVar1->super_ValueType), !bVar3))
        goto LAB_0043531c;
      }
      bVar3 = ValueType::IsNumber(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if ((bVar3) && (bVar3 = ValueType::HasBeenNumber(&pVVar1->super_ValueType), !bVar3))
        goto LAB_0043531c;
      }
      bVar3 = ValueType::IsString(pVVar10);
      if (bVar3) {
        bVar3 = ValueType::IsDefinite(&pVVar1->super_ValueType);
        if ((bVar3) && (bVar3 = ValueType::HasBeenString(&pVVar1->super_ValueType), !bVar3))
        goto LAB_0043531c;
      }
      pVVar11 = &pVVar1->super_ValueType;
      bVar3 = ValueType::IsUndefined(pVVar11);
      if ((((((bVar3) &&
             ((bVar3 = ValueType::IsDefinite(pVVar10), bVar3 &&
              (bVar3 = ValueType::HasBeenUndefined(pVVar10), !bVar3)))) ||
            ((bVar3 = ValueType::IsNull(pVVar11), bVar3 &&
             ((bVar3 = ValueType::IsDefinite(pVVar10), bVar3 &&
              (bVar3 = ValueType::HasBeenNull(pVVar10), !bVar3)))))) ||
           ((bVar3 = ValueType::IsBoolean(pVVar11), bVar3 &&
            ((bVar3 = ValueType::IsDefinite(pVVar10), bVar3 &&
             (bVar3 = ValueType::HasBeenBoolean(pVVar10), !bVar3)))))) ||
          ((bVar3 = ValueType::IsNumber(pVVar11), bVar3 &&
           ((bVar3 = ValueType::IsDefinite(pVVar10), bVar3 &&
            (bVar3 = ValueType::HasBeenNumber(pVVar10), !bVar3)))))) ||
         ((bVar3 = ValueType::IsString(pVVar11), bVar3 &&
          ((bVar3 = ValueType::IsDefinite(pVVar10), bVar3 &&
           (bVar3 = ValueType::HasBeenString(pVVar10), !bVar3)))))) goto LAB_0043531c;
      goto LAB_00435429;
    }
    pFVar9 = this->func;
    bVar3 = true;
LAB_00435398:
    bVar3 = anon_unknown.dwarf_e6eced::Op_JitEq(result,src1Val,src2Val,src1Var,src2Var,pFVar9,bVar3)
    ;
    goto LAB_004353ad;
  case BrNotGe_A:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      left64 = (int64)this;
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
         bVar3)) {
LAB_004352b6:
        bVar4 = SBORROW4(local_38,local_34);
        bVar3 = (int)(local_38 - local_34) < 0;
        goto LAB_004352bc;
      }
      bVar3 = false;
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
      this = (GlobOpt *)left64;
      if (bVar4) goto LAB_004355b4;
    }
    if (src2Var == (Var)0x0 || src1Var == (Var)0x0) {
      return false;
    }
    if (DAT_01441e9e != '\x01') {
      return false;
    }
    iVar6 = Js::JavascriptOperators::GreaterEqual
                      (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
    break;
  case BrNotGt_A:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      left64 = (int64)this;
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
         bVar3)) {
LAB_0043525b:
        bVar12 = SBORROW4(local_38,local_34);
        bVar4 = (int)(local_38 - local_34) < 0;
        bVar3 = local_38 == local_34;
        goto LAB_00435261;
      }
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
      bVar3 = true;
      this = (GlobOpt *)left64;
      if (bVar4) goto LAB_004355b4;
    }
    if (src2Var == (Var)0x0 || src1Var == (Var)0x0) {
      return false;
    }
    if (DAT_01441e9e != '\x01') {
      return false;
    }
    iVar6 = Js::JavascriptOperators::Greater
                      (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
    break;
  case BrNotLt_A:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      left64 = (int64)this;
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
         bVar3)) {
LAB_004351a5:
        bVar4 = SBORROW4(local_38,local_34);
        bVar3 = (int)(local_38 - local_34) < 0;
        goto LAB_004351ab;
      }
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
      bVar3 = true;
      this = (GlobOpt *)left64;
      if (bVar4) goto LAB_004355b4;
    }
    if (src2Var == (Var)0x0 || src1Var == (Var)0x0) {
      return false;
    }
    if (DAT_01441e9e != '\x01') {
      return false;
    }
    iVar6 = Js::JavascriptOperators::Less
                      (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
    break;
  case BrNotLe_A:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      left64 = (int64)this;
      bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
      if ((bVar3) &&
         (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
         bVar3)) {
LAB_00435200:
        bVar12 = SBORROW4(local_38,local_34);
        bVar4 = (int)(local_38 - local_34) < 0;
        bVar3 = local_38 == local_34;
        goto LAB_00435206;
      }
      bVar3 = false;
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
      this = (GlobOpt *)left64;
      if (bVar4) goto LAB_004355b4;
    }
    if (src2Var == (Var)0x0 || src1Var == (Var)0x0) {
      return false;
    }
    if (DAT_01441e9e != '\x01') {
      return false;
    }
    iVar6 = Js::JavascriptOperators::LessEqual
                      (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
    break;
  case BrNotAddr_A:
  case BrAddr_A:
  case BrOnException:
  case BrOnNoException:
  case DeadBrEqual:
  case DeadBrSrEqual:
  case DeadBrRelational:
  case DeadBrOnHasProperty:
  case DeletedNonHelperBranch:
  case BrTrue_I4:
    goto switchD_00434404_caseD_19c;
  case BrEq_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
       bVar3)) {
      *result = local_38 == local_34;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,false),
       bVar3)) {
      bVar3 = CONCAT44(right64._4_4_,(int)right64) == local_50;
      goto LAB_004355b4;
    }
LAB_00435429:
    bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)&DAT_00000001,(bool)uVar8
                      );
LAB_0043542e:
    bVar3 = true;
    if (bVar4 == false) {
      return false;
    }
    goto LAB_004355b4;
  case BrFalse_I4:
    right64._0_4_ = 0;
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&right64,false);
    if (!bVar3) {
      return false;
    }
    bVar3 = (int)right64 == 0;
    goto LAB_004355b4;
  case BrGe_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
       bVar3)) {
      *result = (int)local_34 <= (int)local_38;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,false),
       bVar3)) {
      bVar4 = SBORROW8(CONCAT44(right64._4_4_,(int)right64),local_50);
      bVar3 = (long)(CONCAT44(right64._4_4_,(int)right64) - local_50) < 0;
LAB_004351ab:
      bVar3 = bVar4 == bVar3;
      goto LAB_004355b4;
    }
    goto LAB_00434c2f;
  case BrUnGe_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,true), bVar3
       )) {
      *result = local_34 <= local_38;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,true),
       bVar3)) {
      bVar3 = local_50 <= CONCAT44(right64._4_4_,(int)right64);
      goto LAB_004355b4;
    }
    goto LAB_00434c2f;
  case BrGt_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
       bVar3)) {
      *result = (int)local_34 < (int)local_38;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,false),
       bVar3)) {
      uVar2 = CONCAT44(right64._4_4_,(int)right64);
      bVar12 = SBORROW8(uVar2,local_50);
      bVar4 = (long)(uVar2 - local_50) < 0;
      bVar3 = uVar2 == local_50;
LAB_00435206:
      bVar3 = !bVar3 && bVar12 == bVar4;
      goto LAB_004355b4;
    }
    goto LAB_00434d81;
  case BrUnGt_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,true), bVar3
       )) {
      *result = local_34 < local_38;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,true),
       bVar3)) {
      bVar3 = local_50 < CONCAT44(right64._4_4_,(int)right64);
      goto LAB_004355b4;
    }
    goto LAB_00434d81;
  case BrLt_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
       bVar3)) {
      *result = (int)local_38 < (int)local_34;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,false),
       bVar3)) {
      bVar4 = SBORROW8(CONCAT44(right64._4_4_,(int)right64),local_50);
      bVar3 = (long)(CONCAT44(right64._4_4_,(int)right64) - local_50) < 0;
LAB_004352bc:
      bVar3 = bVar4 != bVar3;
      goto LAB_004355b4;
    }
    goto LAB_00434d81;
  case BrUnLt_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,true), bVar3
       )) {
      *result = local_38 < local_34;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,true),
       bVar3)) {
      bVar3 = CONCAT44(right64._4_4_,(int)right64) < local_50;
      goto LAB_004355b4;
    }
LAB_00434d81:
    bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
LAB_004353e1:
    bVar3 = false;
    goto LAB_004353e7;
  case BrLe_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
       bVar3)) {
      *result = (int)local_38 <= (int)local_34;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,false),
       bVar3)) {
      uVar2 = CONCAT44(right64._4_4_,(int)right64);
      bVar12 = SBORROW8(uVar2,local_50);
      bVar4 = (long)(uVar2 - local_50) < 0;
      bVar3 = uVar2 == local_50;
LAB_00435261:
      bVar3 = bVar3 || bVar12 != bVar4;
      goto LAB_004355b4;
    }
    goto LAB_00434c2f;
  case BrUnLe_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,true), bVar3
       )) {
      *result = local_38 <= local_34;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,true),
       bVar3)) {
      bVar3 = CONCAT44(right64._4_4_,(int)right64) <= local_50;
      goto LAB_004355b4;
    }
LAB_00434c2f:
    bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
    bVar3 = true;
LAB_004353e7:
    if (bVar4 == false) {
      return false;
    }
    goto LAB_004355b4;
  case BrNeq_I4:
    uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
    if ((bVar3) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
       bVar3)) {
      *result = local_38 != local_34;
    }
    bVar3 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((!bVar3) ||
       (bVar3 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_50,false),
       !bVar3)) goto LAB_00434d81;
    bVar3 = CONCAT44(right64._4_4_,(int)right64) == local_50;
    goto LAB_004355b0;
  default:
    switch(instr->m_opcode) {
    case BrEq_A:
      goto switchD_00434404_caseD_195;
    case BrNeq_A:
      goto switchD_00434404_caseD_194;
    case BrFalse_A:
    case BrTrue_A:
      pVVar10 = &src1Val->valueInfo->super_ValueType;
      bVar3 = ValueType::IsNull(pVVar10);
      if ((bVar3) || (bVar3 = ValueType::IsUndefined(pVVar10), bVar3)) {
        bVar3 = instr->m_opcode == BrFalse_A;
      }
      else {
        bVar3 = ValueType::IsObject(pVVar10);
        if ((bVar3) && (OVar5 = ValueType::GetObjectType(pVVar10), Object < OVar5)) {
          bVar3 = instr->m_opcode == BrTrue_A;
        }
        else {
          if (src1Var == (Var)0x0) {
            return false;
          }
          iVar6 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
          if ((Var)CONCAT44(extraout_var,iVar6) == src1Var) {
            bVar3 = true;
          }
          else {
            iVar6 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
            if ((Var)CONCAT44(extraout_var_00,iVar6) == src1Var) {
              bVar3 = false;
            }
            else {
              bVar3 = Js::TaggedInt::Is(src1Var);
              if (bVar3) {
                bVar3 = (undefined1 *)src1Var != &DAT_1000000000000;
              }
              else {
                if ((ulong)src1Var >> 0x32 == 0) {
                  return false;
                }
                left64 = (int64)Js::JavascriptNumber::GetValue(src1Var);
                BVar7 = Js::JavascriptNumber::IsNan((double)left64);
                bVar3 = (double)left64 != 0.0 && BVar7 == 0;
              }
            }
          }
          *result = bVar3;
          if (instr->m_opcode != BrFalse_A) {
            return true;
          }
          bVar3 = (bool)(bVar3 ^ 1);
        }
      }
      goto LAB_004355b4;
    case BrGe_A:
      uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        left64 = (int64)this;
        bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
        if ((bVar3) &&
           (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
           bVar3)) goto LAB_004351a5;
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
        bVar3 = true;
        this = (GlobOpt *)left64;
        if (bVar4) goto LAB_004355b4;
      }
      if (src2Var == (Var)0x0 || src1Var == (Var)0x0) {
        return false;
      }
      if (DAT_01441e9e != '\x01') {
        return false;
      }
      iVar6 = Js::JavascriptOperators::GreaterEqual
                        (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
      break;
    case BrGt_A:
      uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        left64 = (int64)this;
        bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
        if ((bVar3) &&
           (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
           bVar3)) goto LAB_00435200;
        bVar3 = false;
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
        this = (GlobOpt *)left64;
        if (bVar4) goto LAB_004355b4;
      }
      if (src2Var == (Var)0x0 || src1Var == (Var)0x0) {
        return false;
      }
      if (DAT_01441e9e != '\x01') {
        return false;
      }
      iVar6 = Js::JavascriptOperators::Greater
                        (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
      break;
    case BrLt_A:
      uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        left64 = (int64)this;
        bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
        if ((bVar3) &&
           (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
           bVar3)) goto LAB_004352b6;
        bVar3 = false;
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
        this = (GlobOpt *)left64;
        if (bVar4) goto LAB_004355b4;
      }
      if (src2Var == (Var)0x0 || src1Var == (Var)0x0) {
        return false;
      }
      if (DAT_01441e9e != '\x01') {
        return false;
      }
      iVar6 = Js::JavascriptOperators::Less
                        (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
      break;
    case BrLe_A:
      uVar8 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        left64 = (int64)this;
        bVar3 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&local_38,false);
        if ((bVar3) &&
           (bVar3 = ValueInfo::TryGetIntConstantValue(src2Val->valueInfo,(int32 *)&local_34,false),
           bVar3)) goto LAB_0043525b;
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,src2Val,(Value *)0x0,(bool)uVar8);
        bVar3 = true;
        this = (GlobOpt *)left64;
        if (bVar4) goto LAB_004355b4;
      }
      if (src2Var == (Var)0x0 || src1Var == (Var)0x0) {
        return false;
      }
      if (DAT_01441e9e != '\x01') {
        return false;
      }
      iVar6 = Js::JavascriptOperators::LessEqual
                        (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
      break;
    case BrSrEq_A:
      goto switchD_00434404_caseD_197;
    case BrSrNeq_A:
      goto switchD_00434404_caseD_196;
    default:
      goto switchD_00434404_caseD_19c;
    case BrOnObject_A:
      pVVar10 = &src1Val->valueInfo->super_ValueType;
      bVar3 = ValueType::IsDefinite(pVVar10);
      if (!bVar3) {
        return false;
      }
      bVar3 = ValueType::IsPrimitive(pVVar10);
      if (!bVar3) {
        bVar4 = ValueType::HasBeenPrimitive(pVVar10);
        bVar3 = true;
        if (bVar4) {
          return false;
        }
        goto LAB_004355b4;
      }
LAB_0043531c:
      bVar3 = false;
      goto LAB_004355b4;
    }
    bVar3 = iVar6 == 0;
LAB_004355b0:
    bVar3 = !bVar3;
    goto LAB_004355b4;
  }
  bVar3 = iVar6 == 0;
LAB_004355b4:
  *result = bVar3;
  return true;
}

Assistant:

bool
GlobOpt::CanProveConditionalBranch(IR::Instr *instr, Value *src1Val, Value *src2Val, Js::Var src1Var, Js::Var src2Var, bool *result)
{
    auto AreSourcesEqual = [&](Value * val1, Value * val2, bool undefinedCmp) -> bool
    {
        // NaN !== NaN, and objects can have valueOf/toString
        if (val1->IsEqualTo(val2))
        {
            if (val1->GetValueInfo()->IsUndefined())
            {
                return undefinedCmp;
            }
            ValueInfo * valInfo = val1->GetValueInfo();
            return !valInfo->HasBeenUndefined() && valInfo->IsPrimitive() && valInfo->IsNotFloat();
        }
        return false;
    };

    // Make sure GetConstantVar only returns primitives.
    // TODO: OOP JIT, enabled these asserts
    //Assert(!src1Var || !Js::JavascriptOperators::IsObject(src1Var));
    //Assert(!src2Var || !Js::JavascriptOperators::IsObject(src2Var));

    int64 left64, right64;
    int32 left, right;
    int32 constVal;

    switch (instr->m_opcode)
    {
#define BRANCHSIGNED(OPCODE,CMP,TYPE,UNSIGNEDNESS,UNDEFINEDCMP) \
    case Js::OpCode::##OPCODE: \
        if (src1Val && src2Val) \
        { \
            if (src1Val->GetValueInfo()->TryGetIntConstantValue(&left, UNSIGNEDNESS) && \
                src2Val->GetValueInfo()->TryGetIntConstantValue(&right, UNSIGNEDNESS)) \
            { \
                *result = (TYPE)left CMP(TYPE)right; \
            } \
            if (src1Val->GetValueInfo()->TryGetInt64ConstantValue(&left64, UNSIGNEDNESS) && \
                src2Val->GetValueInfo()->TryGetInt64ConstantValue(&right64, UNSIGNEDNESS)) \
            { \
                *result = (TYPE)left64 CMP(TYPE)right64; \
            } \
            else if (AreSourcesEqual(src1Val, src2Val, UNDEFINEDCMP)) \
            { \
                *result = 0 CMP 0; \
            } \
            else \
            { \
                return false; \
            } \
        } \
        else \
        { \
            return false; \
        } \
        break;

        BRANCHSIGNED(BrEq_I4, == , int64, false, true)
        BRANCHSIGNED(BrGe_I4, >= , int64, false, false)
        BRANCHSIGNED(BrGt_I4, > , int64, false, false)
        BRANCHSIGNED(BrLt_I4, < , int64, false, false)
        BRANCHSIGNED(BrLe_I4, <= , int64, false, false)
        BRANCHSIGNED(BrNeq_I4, != , int64, false, false)
        BRANCHSIGNED(BrUnGe_I4, >= , uint64, true, false)
        BRANCHSIGNED(BrUnGt_I4, > , uint64, true, false)
        BRANCHSIGNED(BrUnLt_I4, < , uint64, true, false)
        BRANCHSIGNED(BrUnLe_I4, <= , uint64, true, false)
#undef BRANCHSIGNED
#define BRANCH(OPCODE,CMP,VARCMPFUNC,UNDEFINEDCMP) \
    case Js::OpCode::##OPCODE: \
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) && \
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right)) \
        { \
            *result = left CMP right; \
        } \
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, UNDEFINEDCMP)) \
        { \
            *result = 0 CMP 0; \
        } \
        else if (src1Var && src2Var) \
        { \
            if (func->IsOOPJIT() || !CONFIG_FLAG(OOPJITMissingOpts)) \
            { \
                return false; \
            } \
            *result = VARCMPFUNC(src1Var, src2Var, this->func->GetScriptContext()); \
        } \
        else \
        { \
            return false; \
        } \
        break;

    BRANCH(BrGe_A, >= , Js::JavascriptOperators::GreaterEqual, /*undefinedEquality*/ false)
    BRANCH(BrNotGe_A, <, !Js::JavascriptOperators::GreaterEqual, false)
    BRANCH(BrLt_A, <, Js::JavascriptOperators::Less, false)
    BRANCH(BrNotLt_A, >= , !Js::JavascriptOperators::Less, false)
    BRANCH(BrGt_A, >, Js::JavascriptOperators::Greater, false)
    BRANCH(BrNotGt_A, <= , !Js::JavascriptOperators::Greater, false)
    BRANCH(BrLe_A, <= , Js::JavascriptOperators::LessEqual, false)
    BRANCH(BrNotLe_A, >, !Js::JavascriptOperators::LessEqual, false)
#undef BRANCH
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) &&
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right))
        {
            *result = left == right;
        }
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, true))
        {
            *result = true;
        }
        else if (!src1Var || !src2Var)
        {
            if (BoolAndIntStaticAndTypeMismatch(src1Val, src2Val, src1Var, src2Var))
            {
                *result = false;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitEq(result, src1Val, src2Val, src1Var, src2Var, this->func, false /* isStrict */))
            {
                return false;
            }
        }
        break;
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) &&
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right))
        {
            *result = left != right;
        }
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, true))
        {
            *result = false;
        }
        else if (!src1Var || !src2Var)
        {
            if (BoolAndIntStaticAndTypeMismatch(src1Val, src2Val, src1Var, src2Var))
            {
                *result = true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitNeq(result, src1Val, src2Val, src1Var, src2Var, this->func, false /* isStrict */))
            {
                return false;
            }
        }
        break;
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        if (!src1Var || !src2Var)
        {
            ValueInfo *src1ValInfo = src1Val->GetValueInfo();
            ValueInfo *src2ValInfo = src2Val->GetValueInfo();
            if (
                (src1ValInfo->IsUndefined() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenUndefined()) ||
                (src1ValInfo->IsNull() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNull()) ||
                (src1ValInfo->IsBoolean() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenBoolean()) ||
                (src1ValInfo->IsNumber() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNumber()) ||
                (src1ValInfo->IsString() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenString()) ||

                (src2ValInfo->IsUndefined() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenUndefined()) ||
                (src2ValInfo->IsNull() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNull()) ||
                (src2ValInfo->IsBoolean() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenBoolean()) ||
                (src2ValInfo->IsNumber() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNumber()) ||
                (src2ValInfo->IsString() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenString())
                )
            {
                *result = false;
            }
            else if (AreSourcesEqual(src1Val, src2Val, true))
            {
                *result = true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitEq(result, src1Val, src2Val, src1Var, src2Var, this->func, true /* isStrict */))
            {
                return false;
            }
        }
        break;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
        if (!src1Var || !src2Var)
        {
            ValueInfo *src1ValInfo = src1Val->GetValueInfo();
            ValueInfo *src2ValInfo = src2Val->GetValueInfo();
            if (
                (src1ValInfo->IsUndefined() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenUndefined()) ||
                (src1ValInfo->IsNull() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNull()) ||
                (src1ValInfo->IsBoolean() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenBoolean()) ||
                (src1ValInfo->IsNumber() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNumber()) ||
                (src1ValInfo->IsString() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenString()) ||

                (src2ValInfo->IsUndefined() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenUndefined()) ||
                (src2ValInfo->IsNull() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNull()) ||
                (src2ValInfo->IsBoolean() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenBoolean()) ||
                (src2ValInfo->IsNumber() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNumber()) ||
                (src2ValInfo->IsString() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenString())
                )
            {
                *result = true;
            }
            else if (AreSourcesEqual(src1Val, src2Val, true))
            {
                *result = false;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitNeq(result, src1Val, src2Val, src1Var, src2Var, this->func, true /* isStrict */))
            {
                return false;
            }
        }
        break;

    case Js::OpCode::BrFalse_A:
    case Js::OpCode::BrTrue_A:
    {
        ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
        if (src1ValueInfo->IsNull() || src1ValueInfo->IsUndefined())
        {
            *result = instr->m_opcode == Js::OpCode::BrFalse_A;
            break;
        }
        if (src1ValueInfo->IsObject() && src1ValueInfo->GetObjectType() > ObjectType::Object)
        {
            // Specific object types that are tracked are equivalent to 'true'
            *result = instr->m_opcode == Js::OpCode::BrTrue_A;
            break;
        }

        if (!src1Var)
        {
            return false;
        }

        // Set *result = (evaluates true) and negate it later for BrFalse
        if (src1Var == reinterpret_cast<Js::Var>(this->func->GetScriptContextInfo()->GetTrueAddr()))
        {
            *result = true;
        }
        else if (src1Var == reinterpret_cast<Js::Var>(this->func->GetScriptContextInfo()->GetFalseAddr()))
        {
            *result = false;
        }
        else if (Js::TaggedInt::Is(src1Var))
        {
            *result = (src1Var != reinterpret_cast<Js::Var>(Js::AtomTag_IntPtr));
        }
#if FLOATVAR
        else if (Js::JavascriptNumber::Is_NoTaggedIntCheck(src1Var))
        {
            double value = Js::JavascriptNumber::GetValue(src1Var);
            *result = (!Js::JavascriptNumber::IsNan(value)) && (!Js::JavascriptNumber::IsZero(value));
        }
#endif
        else
        {
            return false;
        }

        if (instr->m_opcode == Js::OpCode::BrFalse_A)
        {
            *result = !(*result);
        }
        break;
    }
    case Js::OpCode::BrFalse_I4:
    {
        constVal = 0;
        if (!src1Val->GetValueInfo()->TryGetIntConstantValue(&constVal))
        {
            return false;
        }

        *result = constVal == 0;
        break;
    }
    case Js::OpCode::BrOnObject_A:
    {
        ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
        if (!src1ValueInfo->IsDefinite())
        {
            return false;
        }

        if (src1ValueInfo->IsPrimitive())
        {
            *result = false;
        }
        else
        {
            if (src1ValueInfo->HasBeenPrimitive())
            {
                return false;
            }
            *result = true;
        }

        break;
    }
    default:
        return false;
    }
    return true;
}